

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::DoubleParameter::SerializeWithCachedSizes
          (DoubleParameter *this,CodedOutputStream *output)

{
  double value;
  
  value = this->defaultvalue_;
  if ((value != 0.0) || (NAN(value))) {
    google::protobuf::internal::WireFormatLite::WriteDouble(1,value,output);
  }
  if (this->_oneof_case_[0] == 10) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (10,&((this->AllowedValues_).range_)->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void DoubleParameter::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.DoubleParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // double defaultValue = 1;
  if (this->defaultvalue() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(1, this->defaultvalue(), output);
  }

  // .CoreML.Specification.DoubleRange range = 10;
  if (has_range()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      10, *AllowedValues_.range_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.DoubleParameter)
}